

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O3

string * __thiscall
pbrt::HomogeneousMedium::ToString_abi_cxx11_(string *__return_storage_ptr__,HomogeneousMedium *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::DenselySampledSpectrum_const&,pbrt::DenselySampledSpectrum_const&,pbrt::DenselySampledSpectrum_const&,pbrt::HGPhaseFunction_const&>
            (__return_storage_ptr__,
             "[ Homogeneous medium sigma_a_spec: %s sigma_s_spec: %s Le_spec: phase: %s ]",
             &this->sigma_a_spec,&this->sigma_s_spec,&this->Le_spec,&this->phase);
  return __return_storage_ptr__;
}

Assistant:

std::string HomogeneousMedium::ToString() const {
    return StringPrintf(
        "[ Homogeneous medium sigma_a_spec: %s sigma_s_spec: %s Le_spec: phase: %s ]",
        sigma_a_spec, sigma_s_spec, Le_spec, phase);
}